

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_table.c
# Opt level: O0

int lj_cf_table_foreachi(lua_State *L)

{
  undefined4 *puVar1;
  MSize MVar2;
  GCtab *t_00;
  GCfunc *pGVar3;
  cTValue *L_00;
  long in_RDI;
  cTValue *val;
  MSize n;
  MSize i;
  GCfunc *func;
  GCtab *t;
  undefined8 in_stack_ffffffffffffff68;
  int narg;
  lua_State *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  uint key;
  
  narg = (int)((ulong)in_stack_ffffffffffffff68 >> 0x20);
  t_00 = lj_lib_checktab(in_stack_ffffffffffffff70,narg);
  pGVar3 = lj_lib_checkfunc(in_stack_ffffffffffffff70,narg);
  MVar2 = lj_tab_len((GCtab *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  key = 1;
  while( true ) {
    if (MVar2 < key) {
      return 0;
    }
    puVar1 = *(undefined4 **)(in_RDI + 0x18);
    *puVar1 = (int)pGVar3;
    puVar1[1] = 0xfffffff7;
    *(double *)(*(long *)(in_RDI + 0x18) + 8) = (double)(int)key;
    if (key < t_00->asize) {
      L_00 = (cTValue *)((ulong)(t_00->array).ptr32 + (long)(int)key * 8);
    }
    else {
      L_00 = lj_tab_getinth(t_00,key);
    }
    if (L_00 == (cTValue *)0x0) {
      *(undefined4 *)(*(long *)(in_RDI + 0x18) + 0x14) = 0xffffffff;
    }
    else {
      ((cTValue *)(*(long *)(in_RDI + 0x18) + 0x10))->field_2 =
           *(anon_struct_8_2_fd66bcdd_for_TValue_2 *)L_00;
    }
    *(long *)(in_RDI + 0x18) = *(long *)(in_RDI + 0x18) + 0x18;
    lua_call((lua_State *)&L_00->field_2,(int)((ulong)L_00 >> 0x20),(int)L_00);
    if (*(int *)(*(long *)(in_RDI + 0x18) + -4) != -1) break;
    *(long *)(in_RDI + 0x18) = *(long *)(in_RDI + 0x18) + -8;
    key = key + 1;
  }
  return 1;
}

Assistant:

LJLIB_CF(table_foreachi)
{
  GCtab *t = lj_lib_checktab(L, 1);
  GCfunc *func = lj_lib_checkfunc(L, 2);
  MSize i, n = lj_tab_len(t);
  for (i = 1; i <= n; i++) {
    cTValue *val;
    setfuncV(L, L->top, func);
    setintV(L->top+1, i);
    val = lj_tab_getint(t, (int32_t)i);
    if (val) { copyTV(L, L->top+2, val); } else { setnilV(L->top+2); }
    L->top += 3;
    lua_call(L, 2, 1);
    if (!tvisnil(L->top-1))
      return 1;
    L->top--;
  }
  return 0;
}